

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall
ImGuiTextFilter::TextRange::split
          (TextRange *this,char separator,ImVector<ImGuiTextFilter::TextRange> *out)

{
  int iVar1;
  TextRange *pTVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  
  iVar1 = out->Capacity;
  if (iVar1 < 0) {
    uVar3 = iVar1 / 2 + iVar1;
    uVar6 = 0;
    if (0 < (int)uVar3) {
      uVar6 = (ulong)uVar3;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pTVar2 = (TextRange *)(*GImAllocatorAllocFunc)(uVar6 << 4,GImAllocatorUserData);
    if (out->Data != (TextRange *)0x0) {
      memcpy(pTVar2,out->Data,(long)out->Size << 4);
      if (out->Data != (TextRange *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(out->Data,GImAllocatorUserData);
    }
    out->Data = pTVar2;
    out->Capacity = (int)uVar6;
  }
  out->Size = 0;
  pcVar7 = this->b;
  pcVar8 = pcVar7;
  if (pcVar7 < this->e) {
    do {
      if (*pcVar7 == separator) {
        iVar1 = out->Capacity;
        if (out->Size == iVar1) {
          if (iVar1 == 0) {
            iVar4 = 8;
          }
          else {
            iVar4 = iVar1 / 2 + iVar1;
          }
          iVar5 = out->Size + 1;
          if (iVar5 < iVar4) {
            iVar5 = iVar4;
          }
          if (iVar1 < iVar5) {
            GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
            pTVar2 = (TextRange *)(*GImAllocatorAllocFunc)((long)iVar5 << 4,GImAllocatorUserData);
            if (out->Data != (TextRange *)0x0) {
              memcpy(pTVar2,out->Data,(long)out->Size << 4);
              if (out->Data != (TextRange *)0x0) {
                GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
              }
              (*GImAllocatorFreeFunc)(out->Data,GImAllocatorUserData);
            }
            out->Data = pTVar2;
            out->Capacity = iVar5;
          }
        }
        pTVar2 = out->Data;
        iVar1 = out->Size;
        pTVar2[iVar1].b = pcVar8;
        pTVar2[iVar1].e = pcVar7;
        out->Size = out->Size + 1;
        pcVar8 = pcVar7 + 1;
      }
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 < this->e);
  }
  if (pcVar8 != pcVar7) {
    iVar1 = out->Capacity;
    if (out->Size == iVar1) {
      iVar4 = out->Size + 1;
      if (iVar1 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar1 / 2 + iVar1;
      }
      if (iVar4 < iVar5) {
        iVar4 = iVar5;
      }
      if (iVar1 < iVar4) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
        pTVar2 = (TextRange *)(*GImAllocatorAllocFunc)((long)iVar4 << 4,GImAllocatorUserData);
        if (out->Data != (TextRange *)0x0) {
          memcpy(pTVar2,out->Data,(long)out->Size << 4);
          if (out->Data != (TextRange *)0x0) {
            GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
          }
          (*GImAllocatorFreeFunc)(out->Data,GImAllocatorUserData);
        }
        out->Data = pTVar2;
        out->Capacity = iVar4;
      }
    }
    pTVar2 = out->Data;
    iVar1 = out->Size;
    pTVar2[iVar1].b = pcVar8;
    pTVar2[iVar1].e = pcVar7;
    out->Size = out->Size + 1;
  }
  return;
}

Assistant:

void ImGuiTextFilter::TextRange::split(char separator, ImVector<TextRange>& out)
{
    out.resize(0);
    const char* wb = b;
    const char* we = wb;
    while (we < e)
    {
        if (*we == separator)
        {
            out.push_back(TextRange(wb, we));
            wb = we + 1;
        }
        we++;
    }
    if (wb != we)
        out.push_back(TextRange(wb, we));
}